

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.cc
# Opt level: O0

size_type __thiscall
absl::string_view::find_last_not_of(string_view *this,string_view s,size_type pos)

{
  string_view wanted;
  bool bVar1;
  unsigned_long *puVar2;
  undefined1 local_140 [8];
  LookupTable tbl;
  unsigned_long local_38;
  size_type i;
  size_type pos_local;
  string_view *this_local;
  string_view s_local;
  
  s_local.ptr_ = (char *)s.length_;
  this_local = (string_view *)s.ptr_;
  i = pos;
  pos_local = (size_type)this;
  bVar1 = empty(this);
  if (bVar1) {
    s_local.length_ = 0xffffffffffffffff;
  }
  else {
    tbl.table_._248_8_ = this->length_ - 1;
    puVar2 = std::min<unsigned_long>(&i,(unsigned_long *)(tbl.table_ + 0xf8));
    local_38 = *puVar2;
    bVar1 = empty((string_view *)&this_local);
    s_local.length_ = local_38;
    if (!bVar1) {
      if (s_local.ptr_ == (char *)0x1) {
        s_local.length_ = find_last_not_of(this,*(char *)&this_local->ptr_,i);
      }
      else {
        wanted.length_ = (size_type)s_local.ptr_;
        wanted.ptr_ = (char *)this_local;
        anon_unknown_2::LookupTable::LookupTable((LookupTable *)local_140,wanted);
        while (bVar1 = anon_unknown_2::LookupTable::operator[]
                                 ((LookupTable *)local_140,this->ptr_[local_38]), bVar1) {
          if (local_38 == 0) {
            return 0xffffffffffffffff;
          }
          local_38 = local_38 - 1;
        }
        s_local.length_ = local_38;
      }
    }
  }
  return s_local.length_;
}

Assistant:

string_view::size_type string_view::find_last_not_of(string_view s,
                                                     size_type pos) const
    noexcept {
  if (empty()) return npos;
  size_type i = std::min(pos, length_ - 1);
  if (s.empty()) return i;
  // Avoid the cost of LookupTable() for a single-character search.
  if (s.length_ == 1) return find_last_not_of(s.ptr_[0], pos);
  LookupTable tbl(s);
  for (;; --i) {
    if (!tbl[ptr_[i]]) {
      return i;
    }
    if (i == 0) break;
  }
  return npos;
}